

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void test_base<int,unsigned_int,bool(*)(int,unsigned_int,int*),int(*)(int,unsigned_int),1>
               (char *type_str,_func_bool_int_uint_int_ptr *fcn1,_func_int_int_uint *fcn2)

{
  bool bVar1;
  runtime_error *prVar2;
  char *pcVar3;
  runtime_error *prVar4;
  TestCase<int,_unsigned_int,_1> TVar5;
  string msg_1;
  safe_test<int,_unsigned_int> st;
  bool actual;
  string msg;
  bool result;
  check_test<int,_unsigned_int> ct;
  int ret;
  TestCase<int,_unsigned_int,_1> test;
  TestVector<int,_unsigned_int,_1> tests;
  _func_int_int_uint *in_stack_fffffffffffffe28;
  safe_test<int,_unsigned_int> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  TestVector<int,_unsigned_int,_1> *in_stack_fffffffffffffe40;
  allocator *paVar6;
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [67];
  undefined1 local_ed;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [66];
  undefined1 local_56;
  int local_54;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_3c;
  byte local_34;
  TestVector<int,_unsigned_int,_1> local_30 [2];
  
  TestVector<int,_unsigned_int,_1>::TestVector(local_30);
  TVar5 = TestVector<int,_unsigned_int,_1>::GetNext(in_stack_fffffffffffffe40);
  local_50 = TVar5._0_8_;
  local_48 = TVar5.fExpected;
  local_3c = local_50;
  local_34 = local_48;
  while( true ) {
    bVar1 = TestVector<int,_unsigned_int,_1>::Done(local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_56 = check_test<int,unsigned_int>::operator()
                         ((check_test<int,_unsigned_int> *)in_stack_fffffffffffffe40,
                          (_func_bool_int_uint_int_ptr *)in_stack_fffffffffffffe38,
                          (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                          (uint)in_stack_fffffffffffffe30,(int *)in_stack_fffffffffffffe28);
    if (local_56 != (local_34 & 1)) break;
    local_54 = safe_test<int,unsigned_int>::operator()
                         (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0,0x185ed0);
    local_ed = 1;
    if ((local_34 & 1) != 1) {
      paVar6 = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Failure in ",paVar6);
      OpName::op_name(1);
      std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
      std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
      std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      prVar2 = prVar4;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::runtime_error::runtime_error(prVar2,pcVar3);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TVar5 = TestVector<int,_unsigned_int,_1>::GetNext(in_stack_fffffffffffffe40);
    local_3c = TVar5._0_8_;
    local_34 = TVar5.fExpected;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Failure in ",&local_d9);
  OpName::op_name(1);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(prVar2,pcVar3);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}